

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::setForegroundBrush(QGraphicsScene *this,QBrush *brush)

{
  bool bVar1;
  QGraphicsScenePrivate *pQVar2;
  const_iterator o;
  QBrush *in_RSI;
  QGraphicsScene *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  QList<QGraphicsView_*> *__range1;
  QGraphicsScenePrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QGraphicsView_*> views_;
  QWidget *in_stack_ffffffffffffff68;
  QAbstractScrollArea *in_stack_ffffffffffffff70;
  QRectF *in_stack_ffffffffffffffb0;
  QGraphicsScene *in_stack_ffffffffffffffb8;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsScene *)0x9cd5e5);
  QBrush::operator=(&pQVar2->foregroundBrush,in_RSI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  views(in_RDI);
  local_28.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QGraphicsView_*>::begin((QList<QGraphicsView_*> *)in_stack_ffffffffffffff70);
  o = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_stack_ffffffffffffff70);
  while( true ) {
    bVar1 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_28,o);
    if (!bVar1) break;
    QList<QGraphicsView_*>::const_iterator::operator*(&local_28);
    QAbstractScrollArea::viewport(in_stack_ffffffffffffff70);
    QWidget::update(in_stack_ffffffffffffff68);
    QList<QGraphicsView_*>::const_iterator::operator++(&local_28);
  }
  QRectF::QRectF((QRectF *)&stack0xffffffffffffffa8);
  update(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0x9cd6ff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setForegroundBrush(const QBrush &brush)
{
    Q_D(QGraphicsScene);
    d->foregroundBrush = brush;
    const auto views_ = views();
    for (QGraphicsView *view : views_)
        view->viewport()->update();
    update();
}